

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O3

VisitReturn __thiscall
QMakeEvaluator::writeFile
          (QMakeEvaluator *this,QString *ctx,QString *fn,OpenMode mode,VfsFlags flags,
          QString *contents)

{
  bool bVar1;
  int id;
  int id_00;
  VisitReturn VVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QString local_a0;
  QString local_88;
  type local_70;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  id = QMakeVfs::idForFileName
                 (this->m_vfs,fn,
                  (VfsFlags)
                  ((uint)flags.super_QFlagsStorageHelper<QMakeVfs::VfsFlag,_4>.
                         super_QFlagsStorage<QMakeVfs::VfsFlag>.i | 0x10));
  id_00 = QMakeVfs::idForFileName(this->m_vfs,fn,flags);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  bVar1 = QMakeVfs::writeFile(this->m_vfs,id_00,mode,flags,contents,&local_58);
  if (bVar1) {
    VVar2 = ReturnTrue;
    if (id != 0) {
      QMakeParser::discardFileFromCache(this->m_parser,id);
    }
  }
  else {
    QVar3.m_data = &DAT_0000001a;
    QVar3.m_size = (qsizetype)&local_88;
    QString::fromLatin1(QVar3);
    QDir::toNativeSeparators((QString *)&local_a0);
    QString::arg<QString_const&,QString,QString&>(&local_70,&local_88,ctx,&local_a0,&local_58);
    message(this,0x310,&local_70);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
      }
    }
    VVar2 = ReturnFalse;
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return VVar2;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn
QMakeEvaluator::writeFile(const QString &ctx, const QString &fn, QIODevice::OpenMode mode,
                          QMakeVfs::VfsFlags flags, const QString &contents)
{
    int oldId = m_vfs->idForFileName(fn, flags | QMakeVfs::VfsAccessedOnly);
    int id = m_vfs->idForFileName(fn, flags | QMakeVfs::VfsCreate);
    QString errStr;
    if (!m_vfs->writeFile(id, mode, flags, contents, &errStr)) {
        evalError(fL1S("Cannot write %1file %2: %3")
                  .arg(ctx, QDir::toNativeSeparators(fn), errStr));
        return ReturnFalse;
    }
    if (oldId)
        m_parser->discardFileFromCache(oldId);
    return ReturnTrue;
}